

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

ptrdiff_t mp_check_strl(char *cur,char *end)

{
  byte bVar1;
  long lVar2;
  
  if (end <= cur) {
    __assert_fail("cur < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x7f4,"ptrdiff_t mp_check_strl(const char *, const char *)");
  }
  bVar1 = *cur;
  if (mp_type_hint[bVar1] == MP_STR) {
    if ((bVar1 & 0xe0) == 0xa0) {
      lVar2 = 1 - (long)end;
    }
    else {
      if (2 < (byte)(bVar1 + 0x27)) {
        __assert_fail("c >= 0xd9 && c <= 0xdb",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                      ,0x7fb,"ptrdiff_t mp_check_strl(const char *, const char *)");
      }
      lVar2 = (ulong)((uint)(1 << (bVar1 & 3)) >> 1) + (1 - (long)end);
    }
    return (ptrdiff_t)(cur + lVar2);
  }
  __assert_fail("mp_typeof(*cur) == MP_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                ,0x7f5,"ptrdiff_t mp_check_strl(const char *, const char *)");
}

Assistant:

MP_IMPL ptrdiff_t
mp_check_strl(const char *cur, const char *end)
{
	assert(cur < end);
	assert(mp_typeof(*cur) == MP_STR);

	uint8_t c = mp_load_u8(&cur);
	if (mp_likely(c & ~0x1f) == 0xa0)
		return cur - end;

	assert(c >= 0xd9 && c <= 0xdb); /* must be checked above by mp_typeof */
	uint32_t hsize = 1U << (c & 0x3) >> 1; /* 0xd9->1, 0xda->2, 0xdb->4 */
	return hsize - (end - cur);
}